

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f wo,Point2f u)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  Vector3f VVar9;
  Vector3f VVar10;
  
  auVar7._4_60_ = wo._12_60_;
  auVar7._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wo._8_56_;
  auVar6._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5 = auVar6._0_16_;
  auVar8._0_8_ = CONCAT44(wo._12_4_,auVar7._0_4_) ^ 0x8000000080000000;
  auVar8._8_4_ = wo._16_4_ ^ 0x80000000;
  auVar8._12_4_ = wo._20_4_ ^ 0x80000000;
  if (auVar7._0_4_ < -auVar7._0_4_) {
    auVar5._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    auVar5._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar5._12_4_ = wo._12_4_ ^ 0x80000000;
  }
  auVar1 = vmaxss_avx(auVar8,auVar7._0_16_);
  VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar5._0_8_;
  VVar9.super_Tuple3<pbrt::Vector3,_float>.z = auVar1._0_4_;
  VVar9 = SampleTrowbridgeReitzVisibleArea(VVar9,this->alpha_x,this->alpha_y,u);
  uVar4 = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  if (auVar7._0_4_ < (float)auVar8._0_8_) {
    uVar4 = uVar4 ^ 0x8000000080000000;
  }
  uVar2 = vcmpss_avx512f(auVar7._0_16_,auVar8,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  VVar10.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar3 * (int)-VVar9.super_Tuple3<pbrt::Vector3,_float>.z +
              (uint)!bVar3 * (int)VVar9.super_Tuple3<pbrt::Vector3,_float>.z);
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar4 >> 0x20);
  return (Vector3f)VVar10.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(Vector3f wo, Point2f u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        return flip ? -wm : wm;
    }